

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateVisitor.cpp
# Opt level: O2

Temporary * __thiscall
IRT::TemplateVisitor<IRT::Temporary>::Accept
          (Temporary *__return_storage_ptr__,TemplateVisitor<IRT::Temporary> *this,
          BaseElement *base_element)

{
  (*base_element->_vptr_BaseElement[2])(base_element);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->tos_value_);
  return __return_storage_ptr__;
}

Assistant:

T TemplateVisitor<T>::Accept(BaseElement* base_element) {
  base_element->Accept(this);
  return tos_value_;
}